

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicDispatchIndirect::CheckBinding
          (BasicDispatchIndirect *this,GLuint expected)

{
  GLboolean local_39;
  double dStack_38;
  GLboolean b;
  GLdouble d;
  GLuint GStack_28;
  GLfloat f;
  GLint64 i64;
  GLint i;
  GLuint expected_local;
  BasicDispatchIndirect *this_local;
  
  i64._4_4_ = expected;
  _i = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90ef,(GLint *)&i64);
  if ((GLuint)i64 == i64._4_4_) {
    glu::CallLogWrapper::glGetInteger64v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90ef,(GLint64 *)&GStack_28);
    if (GStack_28 == i64._4_4_) {
      glu::CallLogWrapper::glGetFloatv
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ef,(GLfloat *)((long)&d + 4));
      if ((GLuint)(long)d._4_4_ == i64._4_4_) {
        glu::CallLogWrapper::glGetDoublev
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90ef,&stack0xffffffffffffffc8);
        if ((GLuint)(long)dStack_38 == i64._4_4_) {
          glu::CallLogWrapper::glGetBooleanv
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90ef,&local_39);
          if ((bool)local_39 == (i64._4_4_ != 0)) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CheckBinding(GLuint expected)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLdouble  d;
		GLboolean b;

		glGetIntegerv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &i);
		if (static_cast<GLuint>(i) != expected)
		{
			return false;
		}
		glGetInteger64v(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &i64);
		if (static_cast<GLuint>(i64) != expected)
		{
			return false;
		}
		glGetFloatv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &f);
		if (static_cast<GLuint>(f) != expected)
		{
			return false;
		}
		glGetDoublev(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &d);
		if (static_cast<GLuint>(d) != expected)
		{
			return false;
		}
		glGetBooleanv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &b);
		if (b != (expected != 0 ? GL_TRUE : GL_FALSE))
		{
			return false;
		}

		return true;
	}